

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FieldDescriptorProto::MergePartialFromCodedStream
          (FieldDescriptorProto *this,CodedInputStream *input)

{
  UnknownFieldSet *unknown_fields;
  uint8 uVar1;
  bool bVar2;
  uint uVar3;
  Limit limit;
  undefined8 in_RAX;
  uint8 *puVar4;
  string *psVar5;
  FieldOptions *this_00;
  uint8 *puVar6;
  int iVar7;
  uint32 tag;
  undefined8 uStack_38;
  
  unknown_fields = &this->_unknown_fields_;
  uStack_38 = in_RAX;
LAB_001e83f5:
  do {
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (tag = (uint32)(char)*puVar4, -1 < (char)*puVar4)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar4 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar3 = tag & 7;
    switch(tag >> 3) {
    case 1:
      if (uVar3 == 2) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
        psVar5 = this->name_;
        if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar5 = (string *)operator_new(0x20);
          (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
          psVar5->_M_string_length = 0;
          (psVar5->field_2)._M_local_buf[0] = '\0';
          this->name_ = psVar5;
        }
        bVar2 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar2) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (*puVar4 == '\x12')) {
          input->buffer_ = puVar4 + 1;
LAB_001e851a:
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x20;
          psVar5 = this->extendee_;
          if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
            psVar5 = (string *)operator_new(0x20);
            (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
            psVar5->_M_string_length = 0;
            (psVar5->field_2)._M_local_buf[0] = '\0';
            this->extendee_ = psVar5;
          }
          bVar2 = internal::WireFormatLite::ReadString(input,psVar5);
          if (!bVar2) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->extendee_->_M_dataplus)._M_p,(int)this->extendee_->_M_string_length,
                     PARSE);
          puVar4 = input->buffer_;
          puVar6 = input->buffer_end_;
          if ((puVar4 < puVar6) && (*puVar4 == '\x18')) {
            puVar4 = puVar4 + 1;
            input->buffer_ = puVar4;
LAB_001e858e:
            if ((puVar4 < puVar6) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
              puVar4 = puVar4 + 1;
              input->buffer_ = puVar4;
              iVar7 = (int)(char)uVar1;
            }
            else {
              bVar2 = io::CodedInputStream::ReadVarint32Fallback
                                (input,(uint32 *)((long)&uStack_38 + 4));
              if (!bVar2) {
                return false;
              }
              puVar4 = input->buffer_;
              puVar6 = input->buffer_end_;
              iVar7 = uStack_38._4_4_;
            }
            this->number_ = iVar7;
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
            if ((puVar4 < puVar6) && (*puVar4 == ' ')) {
              puVar4 = puVar4 + 1;
              input->buffer_ = puVar4;
LAB_001e861a:
              if ((puVar4 < puVar6) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
                input->buffer_ = puVar4 + 1;
                iVar7 = (int)(char)uVar1;
              }
              else {
                bVar2 = io::CodedInputStream::ReadVarint32Fallback
                                  (input,(uint32 *)((long)&uStack_38 + 4));
                if (!bVar2) {
                  return false;
                }
                iVar7 = uStack_38._4_4_;
              }
              if (iVar7 - 1U < 3) {
                *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
                this->label_ = iVar7;
              }
              else {
                UnknownFieldSet::AddVarint(unknown_fields,4,(long)iVar7);
              }
              puVar4 = input->buffer_;
              puVar6 = input->buffer_end_;
              if ((puVar4 < puVar6) && (*puVar4 == '(')) {
                puVar4 = puVar4 + 1;
                input->buffer_ = puVar4;
LAB_001e868c:
                if ((puVar4 < puVar6) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
                  input->buffer_ = puVar4 + 1;
                  iVar7 = (int)(char)uVar1;
                }
                else {
                  bVar2 = io::CodedInputStream::ReadVarint32Fallback
                                    (input,(uint32 *)((long)&uStack_38 + 4));
                  if (!bVar2) {
                    return false;
                  }
                  iVar7 = uStack_38._4_4_;
                }
                if (iVar7 - 1U < 0x12) {
                  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
                  this->type_ = iVar7;
                }
                else {
                  UnknownFieldSet::AddVarint(unknown_fields,5,(long)iVar7);
                }
                puVar4 = input->buffer_;
                if ((puVar4 < input->buffer_end_) && (*puVar4 == '2')) {
                  input->buffer_ = puVar4 + 1;
LAB_001e86fb:
                  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x10;
                  psVar5 = this->type_name_;
                  if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
                    psVar5 = (string *)operator_new(0x20);
                    (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
                    psVar5->_M_string_length = 0;
                    (psVar5->field_2)._M_local_buf[0] = '\0';
                    this->type_name_ = psVar5;
                  }
                  bVar2 = internal::WireFormatLite::ReadString(input,psVar5);
                  if (!bVar2) {
                    return false;
                  }
                  internal::WireFormat::VerifyUTF8StringFallback
                            ((this->type_name_->_M_dataplus)._M_p,
                             (int)this->type_name_->_M_string_length,PARSE);
                  puVar4 = input->buffer_;
                  if ((puVar4 < input->buffer_end_) && (*puVar4 == ':')) {
                    input->buffer_ = puVar4 + 1;
LAB_001e876c:
                    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
                    psVar5 = this->default_value_;
                    if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
                      psVar5 = (string *)operator_new(0x20);
                      (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
                      psVar5->_M_string_length = 0;
                      (psVar5->field_2)._M_local_buf[0] = '\0';
                      this->default_value_ = psVar5;
                    }
                    bVar2 = internal::WireFormatLite::ReadString(input,psVar5);
                    if (!bVar2) {
                      return false;
                    }
                    internal::WireFormat::VerifyUTF8StringFallback
                              ((this->default_value_->_M_dataplus)._M_p,
                               (int)this->default_value_->_M_string_length,PARSE);
                    puVar4 = input->buffer_;
                    if ((puVar4 < input->buffer_end_) && (*puVar4 == 'B')) {
                      input->buffer_ = puVar4 + 1;
LAB_001e87dd:
                      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x80;
                      this_00 = this->options_;
                      if (this_00 == (FieldOptions *)0x0) {
                        this_00 = (FieldOptions *)operator_new(0x70);
                        FieldOptions::FieldOptions(this_00);
                        this->options_ = this_00;
                      }
                      puVar4 = input->buffer_;
                      if ((puVar4 < input->buffer_end_) && (-1 < (char)*puVar4)) {
                        uStack_38 = CONCAT44((int)(char)*puVar4,(undefined4)uStack_38);
                        input->buffer_ = puVar4 + 1;
                      }
                      else {
                        bVar2 = io::CodedInputStream::ReadVarint32Fallback
                                          (input,(uint32 *)((long)&uStack_38 + 4));
                        if (!bVar2) {
                          return false;
                        }
                      }
                      iVar7 = input->recursion_depth_;
                      input->recursion_depth_ = iVar7 + 1;
                      if (input->recursion_limit_ <= iVar7) {
                        return false;
                      }
                      limit = io::CodedInputStream::PushLimit(input,uStack_38._4_4_);
                      bVar2 = FieldOptions::MergePartialFromCodedStream(this_00,input);
                      if (!bVar2) {
                        return false;
                      }
                      if (input->legitimate_message_end_ != true) {
                        return false;
                      }
                      io::CodedInputStream::PopLimit(input,limit);
                      if (0 < input->recursion_depth_) {
                        input->recursion_depth_ = input->recursion_depth_ + -1;
                      }
                      if ((input->buffer_ == input->buffer_end_) &&
                         ((input->buffer_size_after_limit_ != 0 ||
                          (input->total_bytes_read_ == input->current_limit_)))) {
                        input->last_tag_ = 0;
                        input->legitimate_message_end_ = true;
                        return true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001e83f5;
      }
      break;
    case 2:
      if (uVar3 == 2) goto LAB_001e851a;
      break;
    case 3:
      if (uVar3 == 0) {
        puVar4 = input->buffer_;
        puVar6 = input->buffer_end_;
        goto LAB_001e858e;
      }
      break;
    case 4:
      if (uVar3 == 0) {
        puVar4 = input->buffer_;
        puVar6 = input->buffer_end_;
        goto LAB_001e861a;
      }
      break;
    case 5:
      if (uVar3 == 0) {
        puVar4 = input->buffer_;
        puVar6 = input->buffer_end_;
        goto LAB_001e868c;
      }
      break;
    case 6:
      if (uVar3 == 2) goto LAB_001e86fb;
      break;
    case 7:
      if (uVar3 == 2) goto LAB_001e876c;
      break;
    case 8:
      if (uVar3 == 2) goto LAB_001e87dd;
    }
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,unknown_fields);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_extendee;
        break;
      }

      // optional string extendee = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extendee:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_extendee()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->extendee().data(), this->extendee().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_number;
        break;
      }

      // optional int32 number = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_number:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
          set_has_number();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_label;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_label:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Label_IsValid(value)) {
            set_label(static_cast< ::google::protobuf::FieldDescriptorProto_Label >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_type;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_type:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Type_IsValid(value)) {
            set_type(static_cast< ::google::protobuf::FieldDescriptorProto_Type >(value));
          } else {
            mutable_unknown_fields()->AddVarint(5, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_type_name;
        break;
      }

      // optional string type_name = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_type_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->type_name().data(), this->type_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_default_value;
        break;
      }

      // optional string default_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_default_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_default_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->default_value().data(), this->default_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FieldOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}